

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log.c
# Opt level: O2

int test_log(void)

{
  int i;
  uint uVar1;
  char cwd [128];
  char logfile [256];
  
  cwd[0] = '\0';
  cwd[1] = '\0';
  cwd[2] = '\0';
  cwd[3] = '\0';
  cwd[4] = '\0';
  cwd[5] = '\0';
  cwd[6] = '\0';
  cwd[7] = '\0';
  cwd[8] = '\0';
  cwd[9] = '\0';
  cwd[10] = '\0';
  cwd[0xb] = '\0';
  cwd[0xc] = '\0';
  cwd[0xd] = '\0';
  cwd[0xe] = '\0';
  cwd[0xf] = '\0';
  cwd[0x10] = '\0';
  cwd[0x11] = '\0';
  cwd[0x12] = '\0';
  cwd[0x13] = '\0';
  cwd[0x14] = '\0';
  cwd[0x15] = '\0';
  cwd[0x16] = '\0';
  cwd[0x17] = '\0';
  cwd[0x18] = '\0';
  cwd[0x19] = '\0';
  cwd[0x1a] = '\0';
  cwd[0x1b] = '\0';
  cwd[0x1c] = '\0';
  cwd[0x1d] = '\0';
  cwd[0x1e] = '\0';
  cwd[0x1f] = '\0';
  cwd[0x20] = '\0';
  cwd[0x21] = '\0';
  cwd[0x22] = '\0';
  cwd[0x23] = '\0';
  cwd[0x24] = '\0';
  cwd[0x25] = '\0';
  cwd[0x26] = '\0';
  cwd[0x27] = '\0';
  cwd[0x28] = '\0';
  cwd[0x29] = '\0';
  cwd[0x2a] = '\0';
  cwd[0x2b] = '\0';
  cwd[0x2c] = '\0';
  cwd[0x2d] = '\0';
  cwd[0x2e] = '\0';
  cwd[0x2f] = '\0';
  cwd[0x30] = '\0';
  cwd[0x31] = '\0';
  cwd[0x32] = '\0';
  cwd[0x33] = '\0';
  cwd[0x34] = '\0';
  cwd[0x35] = '\0';
  cwd[0x36] = '\0';
  cwd[0x37] = '\0';
  cwd[0x38] = '\0';
  cwd[0x39] = '\0';
  cwd[0x3a] = '\0';
  cwd[0x3b] = '\0';
  cwd[0x3c] = '\0';
  cwd[0x3d] = '\0';
  cwd[0x3e] = '\0';
  cwd[0x3f] = '\0';
  cwd[0x40] = '\0';
  cwd[0x41] = '\0';
  cwd[0x42] = '\0';
  cwd[0x43] = '\0';
  cwd[0x44] = '\0';
  cwd[0x45] = '\0';
  cwd[0x46] = '\0';
  cwd[0x47] = '\0';
  cwd[0x48] = '\0';
  cwd[0x49] = '\0';
  cwd[0x4a] = '\0';
  cwd[0x4b] = '\0';
  cwd[0x4c] = '\0';
  cwd[0x4d] = '\0';
  cwd[0x4e] = '\0';
  cwd[0x4f] = '\0';
  cwd[0x50] = '\0';
  cwd[0x51] = '\0';
  cwd[0x52] = '\0';
  cwd[0x53] = '\0';
  cwd[0x54] = '\0';
  cwd[0x55] = '\0';
  cwd[0x56] = '\0';
  cwd[0x57] = '\0';
  cwd[0x58] = '\0';
  cwd[0x59] = '\0';
  cwd[0x5a] = '\0';
  cwd[0x5b] = '\0';
  cwd[0x5c] = '\0';
  cwd[0x5d] = '\0';
  cwd[0x5e] = '\0';
  cwd[0x5f] = '\0';
  cwd[0x60] = '\0';
  cwd[0x61] = '\0';
  cwd[0x62] = '\0';
  cwd[99] = '\0';
  cwd[100] = '\0';
  cwd[0x65] = '\0';
  cwd[0x66] = '\0';
  cwd[0x67] = '\0';
  cwd[0x68] = '\0';
  cwd[0x69] = '\0';
  cwd[0x6a] = '\0';
  cwd[0x6b] = '\0';
  cwd[0x6c] = '\0';
  cwd[0x6d] = '\0';
  cwd[0x6e] = '\0';
  cwd[0x6f] = '\0';
  cwd[0x70] = '\0';
  cwd[0x71] = '\0';
  cwd[0x72] = '\0';
  cwd[0x73] = '\0';
  cwd[0x74] = '\0';
  cwd[0x75] = '\0';
  cwd[0x76] = '\0';
  cwd[0x77] = '\0';
  cwd[0x78] = '\0';
  cwd[0x79] = '\0';
  cwd[0x7a] = '\0';
  cwd[0x7b] = '\0';
  cwd[0x7c] = '\0';
  cwd[0x7d] = '\0';
  cwd[0x7e] = '\0';
  cwd[0x7f] = '\0';
  memset(logfile,0,0x100);
  getcwd(cwd,0x80);
  sprintf(logfile,"%s/%s",cwd,"test.log");
  qc_log_init(logfile,8,10,5);
  _qc_info("log test start...");
  for (uVar1 = 0; uVar1 != 30000; uVar1 = uVar1 + 1) {
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x37,1,"test debug(level%d) out =========================================== %d",1,
               (ulong)uVar1);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x38,2,"test debug(level%d) out =========================================== %d",2,
               (ulong)uVar1);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x39,3,"test debug(level%d) out =========================================== %d",3,
               (ulong)uVar1);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x3a,4,"test debug(level%d) out =========================================== %d",4,
               (ulong)uVar1);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x3b,5,"test debug(level%d) out =========================================== %d",5,
               (ulong)uVar1);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x3c,6,"test debug(level%d) out =========================================== %d",6,
               (ulong)uVar1);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x3d,7,"test debug(level%d) out =========================================== %d",7,
               (ulong)uVar1);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x3e,8,"test debug(level%d) out =========================================== %d",8,
               (ulong)uVar1);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x3f,9,"test debug(level%d) out =========================================== %d",9,
               (ulong)uVar1);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x40,10,"test debug(level%d) out =========================================== %d",10,
               (ulong)uVar1);
  }
  _qc_info("log test stoped!");
  return 0;
}

Assistant:

int test_log()
{
    char cwd[128];
    char logfile[256];

    memset(cwd, 0, sizeof(cwd));
    memset(logfile, 0, sizeof(logfile));

    getcwd(cwd, sizeof(cwd));

    sprintf(logfile, "%s/%s", cwd, "test.log");

    qc_log_init(logfile, 8, 10, 5);

    qc_info("log test start...");

    for(int i=0; i<30000; i++)
    {
        qc_pdebug(1, "test debug(level%d) out =========================================== %d", 1, i);
        qc_pdebug(2, "test debug(level%d) out =========================================== %d", 2, i);
        qc_pdebug(3, "test debug(level%d) out =========================================== %d", 3, i);
        qc_pdebug(4, "test debug(level%d) out =========================================== %d", 4, i);
        qc_pdebug(5, "test debug(level%d) out =========================================== %d", 5, i);
        qc_pdebug(6, "test debug(level%d) out =========================================== %d", 6, i);
        qc_pdebug(7, "test debug(level%d) out =========================================== %d", 7, i);
        qc_pdebug(8, "test debug(level%d) out =========================================== %d", 8, i);
        qc_pdebug(9, "test debug(level%d) out =========================================== %d", 9, i);
        qc_pdebug(10, "test debug(level%d) out =========================================== %d", 10, i);
    }

    qc_info("log test stoped!");

    return 0;
}